

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_pack.cpp
# Opt level: O0

void libtorrent::run_all_updates(session_impl *ses)

{
  value_type *pvVar1;
  value_type *pvVar2;
  value_type *pvVar3;
  long *plVar4;
  code *local_88;
  code *local_70;
  code *local_58;
  fun_t *f_2;
  int i_2;
  fun_t *f_1;
  int i_1;
  fun_t *f;
  int i;
  session_impl *ses_local;
  
  for (f._4_4_ = 0; f._4_4_ < 0xd; f._4_4_ = f._4_4_ + 1) {
    pvVar1 = aux::
             container_wrapper<libtorrent::str_setting_entry_t,_long,_std::array<libtorrent::str_setting_entry_t,_13UL>_>
             ::operator[]((container_wrapper<libtorrent::str_setting_entry_t,_long,_std::array<libtorrent::str_setting_entry_t,_13UL>_>
                           *)(anonymous_namespace)::str_settings,(long)f._4_4_);
    if (pvVar1->fun != 0) {
      local_58 = (code *)pvVar1->fun;
      plVar4 = (long *)((long)&(ses->super_session_interface).super_session_logger.
                               _vptr_session_logger + *(long *)&pvVar1->field_0x10);
      if (((ulong)local_58 & 1) != 0) {
        local_58 = *(code **)(local_58 + *plVar4 + -1);
      }
      (*local_58)(plVar4);
    }
  }
  for (f_1._4_4_ = 0; f_1._4_4_ < 0x9f; f_1._4_4_ = f_1._4_4_ + 1) {
    pvVar2 = aux::
             container_wrapper<libtorrent::int_setting_entry_t,_long,_std::array<libtorrent::int_setting_entry_t,_159UL>_>
             ::operator[]((container_wrapper<libtorrent::int_setting_entry_t,_long,_std::array<libtorrent::int_setting_entry_t,_159UL>_>
                           *)(anonymous_namespace)::int_settings,(long)f_1._4_4_);
    if (pvVar2->fun != 0) {
      local_70 = (code *)pvVar2->fun;
      plVar4 = (long *)((long)&(ses->super_session_interface).super_session_logger.
                               _vptr_session_logger + *(long *)&pvVar2->field_0x10);
      if (((ulong)local_70 & 1) != 0) {
        local_70 = *(code **)(local_70 + *plVar4 + -1);
      }
      (*local_70)(plVar4);
    }
  }
  for (f_2._4_4_ = 0; f_2._4_4_ < 0x54; f_2._4_4_ = f_2._4_4_ + 1) {
    pvVar3 = aux::
             container_wrapper<libtorrent::bool_setting_entry_t,_long,_std::array<libtorrent::bool_setting_entry_t,_84UL>_>
             ::operator[]((container_wrapper<libtorrent::bool_setting_entry_t,_long,_std::array<libtorrent::bool_setting_entry_t,_84UL>_>
                           *)(anonymous_namespace)::bool_settings,(long)f_2._4_4_);
    if (pvVar3->fun != 0) {
      local_88 = (code *)pvVar3->fun;
      plVar4 = (long *)((long)&(ses->super_session_interface).super_session_logger.
                               _vptr_session_logger + *(long *)&pvVar3->field_0x10);
      if (((ulong)local_88 & 1) != 0) {
        local_88 = *(code **)(local_88 + *plVar4 + -1);
      }
      (*local_88)(plVar4);
    }
  }
  return;
}

Assistant:

void run_all_updates(aux::session_impl& ses)
	{
		using fun_t = void (aux::session_impl::*)();
		for (int i = 0; i < settings_pack::num_string_settings; ++i)
		{
			fun_t const& f = str_settings[i].fun;
			if (f) (ses.*f)();
		}

		for (int i = 0; i < settings_pack::num_int_settings; ++i)
		{
			fun_t const& f = int_settings[i].fun;
			if (f) (ses.*f)();
		}

		for (int i = 0; i < settings_pack::num_bool_settings; ++i)
		{
			fun_t const& f = bool_settings[i].fun;
			if (f) (ses.*f)();
		}
	}